

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

int main(void)

{
  Task TVar1;
  Task TVar2;
  Task TVar3;
  FlowBuilder FVar4;
  FlowBuilder this;
  uint uVar5;
  Executor *this_00;
  Task D;
  Task C;
  Task B;
  Task A;
  Taskflow taskflow;
  Executor executor;
  _Tuple_impl<0UL,_tf::Task,_tf::Task,_tf::Task,_tf::Task> local_2a8;
  _Tuple_impl<0UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&> local_288;
  Task local_268;
  undefined1 local_260 [48];
  Taskflow local_230;
  Executor local_168;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"Runtime Tasking",(allocator<char> *)&local_2a8);
  tf::Taskflow::Taskflow((Taskflow *)(local_260 + 0x30),(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  uVar5 = std::thread::hardware_concurrency();
  local_260._24_8_ = 0;
  local_260._32_8_ = 0;
  tf::Executor::Executor
            (&local_168,(ulong)uVar5,(shared_ptr<tf::WorkerInterface> *)(local_260 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 0x20));
  FVar4._graph = local_230.super_FlowBuilder._graph;
  local_260._16_8_ = 0;
  local_260._8_8_ = (pointer)0x0;
  local_260._0_8_ = (Node *)0x0;
  local_268._node = (Node *)0x0;
  local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<3UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
           super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:14:5)>
               ::_M_invoke;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:14:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 4;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_288);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_288);
  this._graph = local_230.super_FlowBuilder._graph;
  TVar1._node = *(Node **)(*(long *)&((promise<void> *)((long)FVar4._graph + 8))->_M_future + -8);
  local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<3UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
           super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)local_260;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:15:5)>
               ::_M_invoke;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:15:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 2;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)this._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_288);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_288);
  FVar4._graph = local_230.super_FlowBuilder._graph;
  TVar2._node = *(Node **)(*(long *)&((promise<void> *)((long)this._graph + 8))->_M_future + -8);
  local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<3UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
           super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:19:5)>
               ::_M_invoke;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:19:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_288);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_288);
  TVar3._node = *(Node **)(*(long *)&((promise<void> *)((long)FVar4._graph + 8))->_M_future + -8);
  local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<3UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
           super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:20:5)>
               ::_M_invoke;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:20:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
                  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)local_230.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_288);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_288);
  local_2a8.super__Tuple_impl<1UL,_tf::Task,_tf::Task,_tf::Task>.
  super__Tuple_impl<2UL,_tf::Task,_tf::Task>.super__Tuple_impl<3UL,_tf::Task>.
  super__Head_base<3UL,_tf::Task,_false>._M_head_impl._node =
       *(_Head_base<3UL,_tf::Task,_false> *)
        (*(long *)&((promise<void> *)((long)local_230.super_FlowBuilder._graph + 8))->_M_future + -8
        );
  local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<3UL,_tf::Task_&>.
  super__Head_base<3UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<3UL,_tf::Task_&,_false>)&local_268;
  local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Head_base<1UL,_tf::Task_&,_false>._M_head_impl = (Task *)(local_260 + 8);
  local_288.super__Head_base<0UL,_tf::Task_&,_false>._M_head_impl = (Task *)(local_260 + 0x10);
  local_2a8.super__Tuple_impl<1UL,_tf::Task,_tf::Task,_tf::Task>.
  super__Tuple_impl<2UL,_tf::Task,_tf::Task>.super__Head_base<2UL,_tf::Task,_false>._M_head_impl.
  _node = (Task)(Task)TVar3._node;
  local_2a8.super__Tuple_impl<1UL,_tf::Task,_tf::Task,_tf::Task>.
  super__Head_base<1UL,_tf::Task,_false>._M_head_impl._node = (Task)(Task)TVar2._node;
  local_2a8.super__Head_base<0UL,_tf::Task,_false>._M_head_impl._node = (Task)(Task)TVar1._node;
  local_288.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&>.super__Head_base<2UL,_tf::Task_&,_false>.
  _M_head_impl = (Task *)local_260;
  std::_Tuple_impl<0ul,tf::Task&,tf::Task&,tf::Task&,tf::Task&>::
  _M_assign<tf::Task,tf::Task,tf::Task,tf::Task>(&local_288,&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"A",(allocator<char> *)&local_288);
  std::__cxx11::string::_M_assign((string *)(local_260._16_8_ + 8));
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"B",(allocator<char> *)&local_288);
  std::__cxx11::string::_M_assign((string *)(local_260._8_8_ + 8));
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"C",(allocator<char> *)&local_288);
  std::__cxx11::string::_M_assign((string *)(local_260._0_8_ + 8));
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"D",(allocator<char> *)&local_288);
  std::__cxx11::string::_M_assign((string *)&(local_268._node)->_name);
  std::__cxx11::string::~string((string *)&local_2a8);
  tf::Task::precede<tf::Task&,tf::Task&,tf::Task&>
            ((Task *)(local_260 + 0x10),(Task *)(local_260 + 8),(Task *)local_260,&local_268);
  tf::Taskflow::dump((Taskflow *)(local_260 + 0x30),(ostream *)&std::cout);
  this_00 = &local_168;
  tf::Executor::run((Future<void> *)&local_2a8,this_00,(Taskflow *)(local_260 + 0x30));
  std::__basic_future<void>::wait((__basic_future<void> *)&local_2a8,this_00);
  tf::Future<void>::~Future((Future<void> *)&local_2a8);
  tf::Executor::~Executor(&local_168);
  tf::Taskflow::~Taskflow((Taskflow *)(local_260 + 0x30));
  return 0;
}

Assistant:

int main() {

  tf::Taskflow taskflow("Runtime Tasking");
  tf::Executor executor;

  tf::Task A, B, C, D;

  std::tie(A, B, C, D) = taskflow.emplace(
    [] () { return 0; },
    [&C] (tf::Runtime& rt) {  // C must be captured by reference
      std::cout << "B\n";
      rt.schedule(C);
    },
    [] () { std::cout << "C\n"; },
    [] () { std::cout << "D\n"; }
  );

  // name tasks
  A.name("A");
  B.name("B");
  C.name("C");
  D.name("D");

  // create conditional dependencies
  A.precede(B, C, D);

  // dump the graph structure
  taskflow.dump(std::cout);

  // we will see both B and C in the output
  executor.run(taskflow).wait();

  return 0;
}